

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void free_symbol_map_value(void *value,void *cleanup_value_data)

{
  code *cleanup_value;
  
  if (value != (void *)0x0) {
    cleanup_value = free_symbol_map_value;
    if (cleanup_value_data == (void *)0x0) {
      cleanup_value = free_value;
    }
    list_free((ListNode *)((long)value + 8),cleanup_value,(void *)((long)cleanup_value_data + -1));
    free(value);
    return;
  }
  cm_print_error("%s\n","value");
  _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
        ,0x2d2);
}

Assistant:

static void free_symbol_map_value(const void *value,
                                  void *cleanup_value_data) {
    SymbolMapValue * const map_value = (SymbolMapValue*)value;
    const LargestIntegralType children = cast_ptr_to_largest_integral_type(cleanup_value_data);
    assert_non_null(value);
    list_free(&map_value->symbol_values_list_head,
              children ? free_symbol_map_value : free_value,
              (void *) ((uintptr_t)children - 1));
    free(map_value);
}